

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

void idx2::PrintStatistics(brick_pool *Bp)

{
  idx2_file *piVar1;
  v3<int> *pvVar2;
  long lVar3;
  hash_table<unsigned_long,_idx2::brick_volume> *Ht;
  hash_table<unsigned_long,_idx2::brick_volume> *extraout_RDX;
  hash_table<unsigned_long,_idx2::brick_volume> *Ht_00;
  f64 Percent;
  i64 NBricks;
  undefined1 local_128 [6];
  i8 L;
  i8 Level;
  brick_volume *local_118;
  hash_table<unsigned_long,_idx2::brick_volume> *local_110;
  undefined1 local_108 [8];
  iterator BIt;
  i64 Count [16];
  idx2_file *Idx2;
  brick_pool *Bp_local;
  
  piVar1 = Bp->Idx2;
  memset(&BIt.Idx,0,0x80);
  Begin<unsigned_long,idx2::brick_volume>((iterator *)local_108,(idx2 *)Bp,Ht);
  Ht_00 = extraout_RDX;
  while (End<unsigned_long,idx2::brick_volume>((iterator *)local_128,(idx2 *)Bp,Ht_00),
        BIt.Val != local_118 || BIt.Ht != local_110) {
    lVar3 = (long)(char)((byte)*(unsigned_long *)local_108 & 0xf);
    Count[lVar3 + -1] = Count[lVar3 + -1] + 1;
    do {
      BIt.Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)((long)&(BIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(BIt.Ht)->Keys +
                      (long)&(((BIt.Val)->Vol).Buffer.Alloc)->_vptr_allocator) != '\x02');
    local_108 = (undefined1  [8])(((BIt.Val)->Vol).Buffer.Data + (long)BIt.Ht * 8);
    Ht_00 = (hash_table<unsigned_long,_idx2::brick_volume> *)((long)BIt.Ht * 0x40);
    BIt.Key = (unsigned_long *)((long)&Ht_00->Keys + ((BIt.Val)->Vol).Buffer.Bytes);
  }
  NBricks._6_1_ = '\0';
  while( true ) {
    if (NBricks._6_1_ == piVar1->NLevels) {
      return;
    }
    if (0xf < NBricks._6_1_) break;
    pvVar2 = (piVar1->NBricks3).Arr + (int)NBricks._6_1_;
    lVar3 = (long)(pvVar2->field_0).field_0.X * (long)(pvVar2->field_0).field_0.Y *
            (long)(pvVar2->field_0).field_0.Z;
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n",
           ((double)Count[(long)NBricks._6_1_ + -1] * 100.0) / (double)lVar3,
           (ulong)(uint)(int)NBricks._6_1_,Count[(long)NBricks._6_1_ + -1],lVar3);
    NBricks._6_1_ = NBricks._6_1_ + '\x01';
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
               );
}

Assistant:

void
PrintStatistics(const brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  i64 Count[idx2_file::MaxLevels] = {};

  idx2_ForEach (BIt, Bp->BrickTable)
  {
    i8 Level = GetLevelFromBrickKey(*BIt.Key);
    ++Count[Level];
  }
  idx2_For (i8, L, 0, Idx2->NLevels)
  {
    i64 NBricks = Prod<i64>(Idx2->NBricks3[L]);
    f64 Percent = f64(Count[L]) * 100 / f64(NBricks);
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n", L, Count[L], NBricks, Percent);
  }
}